

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_raw.c
# Opt level: O3

int archive_read_format_raw_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  long *plVar1;
  long lVar2;
  size_t in_RAX;
  void *pvVar3;
  int iVar4;
  ssize_t avail;
  size_t local_38;
  
  plVar1 = (long *)a->format->data;
  local_38 = in_RAX;
  if (plVar1[1] != 0) {
    __archive_read_consume(a,plVar1[1]);
    plVar1[1] = 0;
  }
  iVar4 = 1;
  if ((int)plVar1[2] == 0) {
    pvVar3 = __archive_read_ahead(a,1,(ssize_t *)&local_38);
    *buff = pvVar3;
    if ((long)local_38 < 1) {
      if (local_38 == 0) {
        *(undefined4 *)(plVar1 + 2) = 1;
        *size = 0;
        *offset = *plVar1;
      }
      else {
        *size = 0;
        *offset = *plVar1;
        iVar4 = (int)local_38;
      }
    }
    else {
      *size = local_38;
      lVar2 = *plVar1;
      *offset = lVar2;
      *plVar1 = lVar2 + *size;
      plVar1[1] = local_38;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static int
archive_read_format_raw_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct raw_info *info;
	ssize_t avail;

	info = (struct raw_info *)(a->format->data);

	/* Consume the bytes we read last time. */
	if (info->unconsumed) {
		__archive_read_consume(a, info->unconsumed);
		info->unconsumed = 0;
	}

	if (info->end_of_file)
		return (ARCHIVE_EOF);

	/* Get whatever bytes are immediately available. */
	*buff = __archive_read_ahead(a, 1, &avail);
	if (avail > 0) {
		/* Return the bytes we just read */
		*size = avail;
		*offset = info->offset;
		info->offset += *size;
		info->unconsumed = avail;
		return (ARCHIVE_OK);
	} else if (0 == avail) {
		/* Record and return end-of-file. */
		info->end_of_file = 1;
		*size = 0;
		*offset = info->offset;
		return (ARCHIVE_EOF);
	} else {
		/* Record and return an error. */
		*size = 0;
		*offset = info->offset;
		return ((int)avail);
	}
}